

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

UINT8 __thiscall VGMPlayer::Stop(VGMPlayer *this)

{
  size_type sVar1;
  reference pvVar2;
  PCM_BANK *this_00;
  reference cBaseDev;
  PCM_BANK *pcmBnk;
  DEV_INFO *devInf;
  size_t curBank;
  size_t curDev;
  VGMPlayer *this_local;
  
  this->_playState = this->_playState & 0xfe;
  curBank = 0;
  while( true ) {
    sVar1 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::size
                      (&this->_dacStreams);
    if (sVar1 <= curBank) break;
    pvVar2 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::
             operator[](&this->_dacStreams,curBank);
    (*((pvVar2->defInf).devDef)->Stop)((pvVar2->defInf).dataPtr);
    curBank = curBank + 1;
  }
  std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::clear
            (&this->_dacStreams);
  for (devInf = (DEV_INFO *)0x0; devInf < (DEV_INFO *)0x40;
      devInf = (DEV_INFO *)((long)&devInf->dataPtr + 1)) {
    this_00 = this->_pcmBank + (long)devInf;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this_00->bankOfs);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this_00->bankSize);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this_00->data);
  }
  free((this->_pcmComprTbl).values.d8);
  (this->_pcmComprTbl).values.d8 = (UINT8 *)0x0;
  curBank = 0;
  while( true ) {
    sVar1 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                      (&this->_devices);
    if (sVar1 <= curBank) break;
    cBaseDev = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
               operator[](&this->_devices,curBank);
    FreeDeviceTree(&cBaseDev->base,'\0');
    curBank = curBank + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_devNames);
  std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::clear
            (&this->_devices);
  std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::clear
            (&this->_devCfgs);
  if ((this->super_PlayerBase)._eventCbFunc != (PLAYER_EVENT_CB)0x0) {
    (*(this->super_PlayerBase)._eventCbFunc)
              (&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x02',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 VGMPlayer::Stop(void)
{
	size_t curDev;
	size_t curBank;
	
	_playState &= ~PLAYSTATE_PLAY;
	
	for (curDev = 0; curDev < _dacStreams.size(); curDev ++)
	{
		DEV_INFO* devInf = &_dacStreams[curDev].defInf;
		devInf->devDef->Stop(devInf->dataPtr);
	}
	_dacStreams.clear();
	
	for (curBank = 0x00; curBank < _PCM_BANK_COUNT; curBank ++)
	{
		PCM_BANK* pcmBnk = &_pcmBank[curBank];
		pcmBnk->bankOfs.clear();
		pcmBnk->bankSize.clear();
		pcmBnk->data.clear();
	}
	free(_pcmComprTbl.values.d8);	_pcmComprTbl.values.d8 = NULL;
	
	for (curDev = 0; curDev < _devices.size(); curDev ++)
		FreeDeviceTree(&_devices[curDev].base, 0);
	_devNames.clear();
	_devices.clear();
	_devCfgs.clear();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_STOP, NULL);
	
	return 0x00;
}